

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools_inl.hpp
# Opt level: O3

size_t CLI::detail::close_sequence(string *str,size_t start,char closure_char)

{
  pointer pcVar1;
  char cVar2;
  long lVar3;
  ulong uVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  string closures;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  lVar3 = ::std::__cxx11::string::find
                    (-0x78,CONCAT71(in_register_00000011,closure_char) & 0xffffffff);
  if ((lVar3 - 1U < 2) || (lVar3 == -1)) {
    uVar4 = ::std::__cxx11::string::find((char)str,(ulong)(uint)(int)closure_char);
    if (uVar4 == 0xffffffffffffffff) {
      uVar4 = str->_M_string_length;
    }
  }
  else if (lVar3 == 0) {
    uVar4 = start + 1;
    if (uVar4 < str->_M_string_length) {
      do {
        cVar2 = (str->_M_dataplus)._M_p[uVar4];
        if (cVar2 == closure_char) {
          return uVar4;
        }
        uVar5 = uVar4;
        if (cVar2 == '\\') {
          uVar5 = start + 2;
        }
        uVar4 = uVar5 + 1;
        start = uVar5;
      } while (uVar4 < str->_M_string_length);
    }
  }
  else {
    local_50 = local_40;
    ::std::__cxx11::string::_M_construct((ulong)&local_50,'\x01');
    uVar5 = start + 1;
    uVar4 = str->_M_string_length;
    if (uVar5 < str->_M_string_length) {
      do {
        cVar2 = (str->_M_dataplus)._M_p[uVar5];
        if (cVar2 == local_50[local_48 + -1]) {
          ::std::__cxx11::string::pop_back();
          uVar4 = uVar5;
          if (local_48 == 0) break;
          cVar2 = (str->_M_dataplus)._M_p[uVar5];
        }
        lVar3 = ::std::__cxx11::string::find('h',(ulong)(uint)(int)cVar2);
        if (lVar3 - 1U < 2) {
          uVar7 = ::std::__cxx11::string::find
                            ((char)str,(ulong)(uint)(int)(str->_M_dataplus)._M_p[uVar5]);
          if (uVar7 == 0xffffffffffffffff) {
            uVar7 = str->_M_string_length;
          }
        }
        else {
          uVar7 = uVar5;
          if (lVar3 != -1) {
            if (lVar3 == 0) {
              uVar7 = start + 2;
              if (uVar7 < str->_M_string_length) {
                pcVar1 = (str->_M_dataplus)._M_p;
                uVar4 = uVar5;
                uVar6 = uVar7;
                do {
                  cVar2 = pcVar1[uVar6];
                  uVar7 = uVar6;
                  if (cVar2 == pcVar1[uVar5]) break;
                  if (cVar2 == '\\') {
                    uVar6 = uVar4 + 2;
                  }
                  uVar7 = uVar6 + 1;
                  uVar4 = uVar6;
                  uVar6 = uVar7;
                } while (uVar7 < str->_M_string_length);
              }
            }
            else {
              ::std::__cxx11::string::push_back((char)&local_50);
            }
          }
        }
        uVar5 = uVar7 + 1;
        uVar4 = str->_M_string_length;
        start = uVar7;
      } while (uVar5 < uVar4);
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  return uVar4;
}

Assistant:

CLI11_INLINE std::size_t close_sequence(const std::string &str, std::size_t start, char closure_char) {

    auto bracket_loc = matchBracketChars.find(closure_char);
    switch(bracket_loc) {
    case 0:
        return close_string_quote(str, start, closure_char);
    case 1:
    case 2:
#if defined(_MSC_VER) && _MSC_VER < 1920
    case(std::size_t)-1:
#else
    case std::string::npos:
#endif
        return close_literal_quote(str, start, closure_char);
    default:
        break;
    }

    std::string closures(1, closure_char);
    auto loc = start + 1;

    while(loc < str.size()) {
        if(str[loc] == closures.back()) {
            closures.pop_back();
            if(closures.empty()) {
                return loc;
            }
        }
        bracket_loc = bracketChars.find(str[loc]);
        if(bracket_loc != std::string::npos) {
            switch(bracket_loc) {
            case 0:
                loc = close_string_quote(str, loc, str[loc]);
                break;
            case 1:
            case 2:
                loc = close_literal_quote(str, loc, str[loc]);
                break;
            default:
                closures.push_back(matchBracketChars[bracket_loc]);
                break;
            }
        }
        ++loc;
    }
    if(loc > str.size()) {
        loc = str.size();
    }
    return loc;
}